

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O2

void __thiscall luna::GC::MinorGCSweep(GC *this)

{
  uint *puVar1;
  byte bVar2;
  GCObject *__args;
  
  while (__args = (this->gen0_).gen_, __args != (GCObject *)0x0) {
    (this->gen0_).gen_ = __args->next_;
    bVar2 = __args->field_0x10;
    if ((bVar2 & 0xc) == 4) {
      __args->field_0x10 = (bVar2 & 0xf0) + 1;
      __args->next_ = (this->gen1_).gen_;
      (this->gen1_).gen_ = __args;
      puVar1 = &(this->gen1_).count_;
      *puVar1 = *puVar1 + 1;
    }
    else {
      std::function<void_(luna::GCObject_*,_unsigned_int)>::operator()
                (&this->obj_deleter_,__args,(uint)(bVar2 >> 4));
    }
  }
  (this->gen0_).count_ = 0;
  return;
}

Assistant:

void GC::MinorGCSweep()
    {
        // Sweep GCGen0
        while (gen0_.gen_)
        {
            GCObject *obj = gen0_.gen_;
            gen0_.gen_ = gen0_.gen_->next_;

            // Move object to GCGen1 generation when object is black
            if (obj->gc_ == GCFlag_Black)
            {
                obj->gc_ = GCFlag_White;
                obj->generation_ = GCGen1;
                obj->next_ = gen1_.gen_;
                gen1_.gen_ = obj;
                gen1_.count_++;
            }
            else
            {
                obj_deleter_(obj, obj->gc_obj_type_);
            }
        }

        gen0_.count_ = 0;
    }